

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

char * ucnv_io_getConverterName_63(char *alias,UBool *containsOption,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  ushort uVar2;
  bool bVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  UConverterAliasOptions *pUVar6;
  uint16_t *puVar7;
  uint16_t *puVar8;
  UBool UVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  bool bVar13;
  char *dst;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  bool bVar17;
  char strippedName [60];
  char local_78 [72];
  
  bVar17 = false;
  bVar13 = true;
  do {
    if (bVar17) {
      if (*alias != 'x') {
        return (char *)0x0;
      }
      if (alias[1] != '-') {
        return (char *)0x0;
      }
      alias = alias + 2;
    }
    UVar9 = haveAliasData(pErrorCode);
    pUVar6 = gMainTable.optionTable;
    if (UVar9 == '\0') {
      return (char *)0x0;
    }
    if (alias == (char *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return (char *)0x0;
    }
    if (*alias == '\0') {
      return (char *)0x0;
    }
    uVar1 = (gMainTable.optionTable)->stringNormalizationType;
    dst = alias;
    if (uVar1 == 0) {
LAB_0010d876:
      puVar8 = gMainTable.normalizedStringTable;
      puVar7 = gMainTable.stringTable;
      puVar4 = gMainTable.aliasList;
      uVar14 = 0;
      uVar15 = gMainTable.untaggedConvArraySize;
      uVar16 = gMainTable.untaggedConvArraySize >> 1;
      do {
        if (uVar1 == 0) {
          iVar10 = ucnv_compareNames_63(dst,(char *)(puVar7 + puVar4[uVar16]));
        }
        else {
          iVar10 = strcmp(dst,(char *)(puVar8 + puVar4[uVar16]));
        }
        puVar5 = gMainTable.untaggedConvArray;
        uVar11 = uVar16;
        if ((-1 < iVar10) && (uVar11 = uVar15, uVar14 = uVar16, iVar10 == 0)) {
          uVar2 = gMainTable.untaggedConvArray[uVar16];
          if ((short)uVar2 < 0) {
            *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
          }
          if (containsOption != (UBool *)0x0) {
            *containsOption = (byte)(uVar2 >> 0xe) & 1 | (char)pUVar6->containsCnvOptionInfo == '\0'
            ;
            uVar2 = puVar5[uVar16];
          }
          if ((uVar2 & 0xfff) < gMainTable.converterListSize) {
            return (char *)(puVar7 + gMainTable.converterList[uVar2 & 0xfff]);
          }
          break;
        }
        uVar15 = uVar11;
        uVar11 = uVar15 + uVar14 >> 1;
        bVar17 = uVar16 != uVar11;
        uVar16 = uVar11;
      } while (bVar17);
    }
    else {
      sVar12 = strlen(alias);
      if (sVar12 < 0x3c) {
        dst = local_78;
        ucnv_io_stripASCIIForCompare_63(dst,alias);
        goto LAB_0010d876;
      }
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    bVar17 = true;
    bVar3 = !bVar13;
    bVar13 = false;
    if (bVar3) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

U_CAPI const char *
ucnv_io_getConverterName(const char *alias, UBool *containsOption, UErrorCode *pErrorCode) {
    const char *aliasTmp = alias;
    int32_t i = 0;
    for (i = 0; i < 2; i++) {
        if (i == 1) {
            /*
             * After the first unsuccess converter lookup, check to see if
             * the name begins with 'x-'. If it does, strip it off and try
             * again.  This behaviour is similar to how ICU4J does it.
             */
            if (aliasTmp[0] == 'x' && aliasTmp[1] == '-') {
                aliasTmp = aliasTmp+2;
            } else {
                break;
            }
        }
        if(haveAliasData(pErrorCode) && isAlias(aliasTmp, pErrorCode)) {
            uint32_t convNum = findConverter(aliasTmp, containsOption, pErrorCode);
            if (convNum < gMainTable.converterListSize) {
                return GET_STRING(gMainTable.converterList[convNum]);
            }
            /* else converter not found */
        } else {
            break;
        }
    }

    return NULL;
}